

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

ParseLocation __thiscall
google::protobuf::TextFormat::ParseInfoTree::GetLocation
          (ParseInfoTree *this,FieldDescriptor *field,int index)

{
  pointer pPVar1;
  ParseLocation PVar2;
  second_type *psVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  FieldDescriptor *local_30;
  
  uVar5 = 0xffffffff00000000;
  uVar6 = 0xffffffff;
  local_30 = field;
  CheckFieldIndex(field,index);
  psVar3 = FindOrNull<std::map<google::protobuf::FieldDescriptor_const*,std::vector<google::protobuf::TextFormat::ParseLocation,std::allocator<google::protobuf::TextFormat::ParseLocation>>,std::less<google::protobuf::FieldDescriptor_const*>,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::vector<google::protobuf::TextFormat::ParseLocation,std::allocator<google::protobuf::TextFormat::ParseLocation>>>>>>
                     (&this->locations_,&local_30);
  if (psVar3 != (second_type *)0x0) {
    iVar4 = 0;
    if (index != -1) {
      iVar4 = index;
    }
    pPVar1 = (psVar3->
             super__Vector_base<google::protobuf::TextFormat::ParseLocation,_std::allocator<google::protobuf::TextFormat::ParseLocation>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(long)iVar4 <
        (ulong)((long)(psVar3->
                      super__Vector_base<google::protobuf::TextFormat::ParseLocation,_std::allocator<google::protobuf::TextFormat::ParseLocation>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 3)) {
      PVar2 = pPVar1[iVar4];
      uVar5 = (ulong)PVar2 & 0xffffffff00000000;
      uVar6 = (ulong)PVar2 & 0xffffffff;
    }
  }
  return (ParseLocation)(uVar5 | uVar6);
}

Assistant:

TextFormat::ParseLocation TextFormat::ParseInfoTree::GetLocation(
    const FieldDescriptor* field, int index) const {
  CheckFieldIndex(field, index);
  if (index == -1) { index = 0; }

  const std::vector<TextFormat::ParseLocation>* locations =
      FindOrNull(locations_, field);
  if (locations == NULL || index >= locations->size()) {
    return TextFormat::ParseLocation();
  }

  return (*locations)[index];
}